

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

Type __thiscall wasm::Random::pick<wasm::Type>(Random *this,FeatureOptions<wasm::Type> *picker)

{
  value_type *pvVar1;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_38;
  FeatureOptions<wasm::Type> *local_20;
  FeatureOptions<wasm::Type> *picker_local;
  Random *this_local;
  
  local_20 = picker;
  picker_local = (FeatureOptions<wasm::Type> *)this;
  items<wasm::Type>(&local_38,this,picker);
  pvVar1 = pick<std::vector<wasm::Type,std::allocator<wasm::Type>>>(this,&local_38);
  this_local = (Random *)pvVar1->id;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_38);
  return (Type)(uintptr_t)this_local;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }